

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawCircleLinesV(Vector2 center,float radius,Color color)

{
  uint uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  undefined4 local_48;
  undefined4 uStack_44;
  
  rlBegin(1);
  rlColor4ub(color.r,color.g,color.b,color.a);
  uStack_44 = center.y;
  uVar1 = 0;
  do {
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    local_48 = center.x;
    fVar4 = sinf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar3 * radius + local_48,fVar4 * radius + uStack_44);
    fVar3 = (float)(int)(uVar1 + 10) * 0.017453292;
    fVar4 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    rlVertex2f(fVar4 * radius + local_48,fVar3 * radius + uStack_44);
    bVar2 = uVar1 < 0x15e;
    uVar1 = uVar1 + 10;
  } while (bVar2);
  rlEnd();
  return;
}

Assistant:

void DrawCircleLinesV(Vector2 center, float radius, Color color)
{
    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);

        // NOTE: Circle outline is drawn pixel by pixel every degree (0 to 360)
        for (int i = 0; i < 360; i += 10)
        {
            rlVertex2f(center.x + cosf(DEG2RAD*i)*radius, center.y + sinf(DEG2RAD*i)*radius);
            rlVertex2f(center.x + cosf(DEG2RAD*(i + 10))*radius, center.y + sinf(DEG2RAD*(i + 10))*radius);
        }
    rlEnd();
}